

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_page_operator.c
# Opt level: O3

HPDF_STATUS HPDF_Page_MoveTextPos2(HPDF_Page page,HPDF_REAL x,HPDF_REAL y)

{
  void *pvVar1;
  HPDF_STATUS HVar2;
  char *pcVar3;
  float fVar4;
  float fVar5;
  char buf [512];
  char local_228 [511];
  char local_29 [9];
  
  HVar2 = HPDF_Page_CheckState(page,4);
  if (HVar2 == 0) {
    pvVar1 = page->attr;
    HPDF_MemSet(local_228,'\0',0x200);
    pcVar3 = HPDF_FToA(local_228,x,local_29);
    *pcVar3 = ' ';
    pcVar3 = HPDF_FToA(pcVar3 + 1,y,local_29);
    HPDF_StrCpy(pcVar3," TD\n",local_29);
    HVar2 = HPDF_Stream_WriteStr(*(HPDF_Stream *)((long)pvVar1 + 0x70),local_228);
    if (HVar2 == 0) {
      fVar4 = (float)*(undefined8 *)((long)pvVar1 + 0x58) +
              *(float *)((long)pvVar1 + 0x48) * x +
              (float)((ulong)*(undefined8 *)((long)pvVar1 + 0x4c) >> 0x20) * y;
      fVar5 = (float)((ulong)*(undefined8 *)((long)pvVar1 + 0x58) >> 0x20) +
              *(float *)((long)pvVar1 + 0x54) * y + (float)*(undefined8 *)((long)pvVar1 + 0x4c) * x;
      *(ulong *)((long)pvVar1 + 0x58) = CONCAT44(fVar5,fVar4);
      *(ulong *)((long)pvVar1 + 0x40) = CONCAT44(fVar5,fVar4);
      *(float *)(*(long *)((long)pvVar1 + 0x28) + 0x60) = -y;
      HVar2 = 0;
    }
    else {
      HVar2 = HPDF_CheckError(page->error);
    }
  }
  return HVar2;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_Page_MoveTextPos2  (HPDF_Page  page,
                         HPDF_REAL  x,
                         HPDF_REAL  y)
{
    HPDF_STATUS ret = HPDF_Page_CheckState (page, HPDF_GMODE_TEXT_OBJECT);
    char buf[HPDF_TMP_BUF_SIZ];
    char *pbuf = buf;
    char *eptr = buf + HPDF_TMP_BUF_SIZ - 1;
    HPDF_PageAttr attr;

    HPDF_PTRACE ((" HPDF_Page_MoveTextPos2\n"));

    if (ret != HPDF_OK)
        return ret;

    attr = (HPDF_PageAttr)page->attr;

    HPDF_MemSet (buf, 0, HPDF_TMP_BUF_SIZ);

    pbuf = HPDF_FToA (pbuf, x, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, y, eptr);
    HPDF_StrCpy (pbuf, " TD\012", eptr);

    if (HPDF_Stream_WriteStr (attr->stream, buf) != HPDF_OK)
        return HPDF_CheckError (page->error);

    attr->text_matrix.x += x * attr->text_matrix.a + y * attr->text_matrix.c;
    attr->text_matrix.y += y * attr->text_matrix.d + x * attr->text_matrix.b;
    attr->text_pos.x = attr->text_matrix.x;
    attr->text_pos.y = attr->text_matrix.y;
    attr->gstate->text_leading = -y;

    return ret;
}